

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void wasm::
     CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
     ::doStartLoop(HeapStoreOptimization *self,Expression **currp)

{
  BasicBlock **__x;
  CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
  *this;
  char *__to;
  
  __x = &(self->
         super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
         ).
         super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
         .currBasicBlock;
  this = (CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
          *)(self->
            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
            ).
            super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
            .currBasicBlock;
  startBasicBlock(&(self->
                   super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                   ).
                   super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                 );
  std::
  vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
  ::push_back(&(self->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
               .loopTops,__x);
  link(this,(char *)(self->
                    super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                    ).
                    super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                    .currBasicBlock,__to);
  std::
  vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
  ::push_back(&(self->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
               .loopLastBlockStack,__x);
  return;
}

Assistant:

static void doStartLoop(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    // a loop with no backedges would still be counted here, but oh well
    self->loopTops.push_back(self->currBasicBlock);
    self->link(last, self->currBasicBlock);
    self->loopLastBlockStack.push_back(self->currBasicBlock);
  }